

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secretbox.h
# Opt level: O0

void hydro_secretbox_setup
               (uint8_t *buf,uint64_t msg_id,char *ctx,uint8_t *key,uint8_t *iv,uint8_t key_tag)

{
  void *in_RCX;
  uint8_t (*in_RDX) [8];
  uint64_t in_RSI;
  uint8_t (*in_RDI) [8];
  void *in_R8;
  undefined1 in_R9B;
  uint8_t msg_id_le [8];
  uint8_t in_stack_ffffffffffffffcf;
  undefined7 in_stack_ffffffffffffffd0;
  
  mem_zero(in_RDI,0x30);
  *in_RDI = (uint8_t  [8])0x836353278627306;
  in_RDI[1] = *in_RDX;
  gimli_core_u8((uint8_t *)CONCAT17(in_R9B,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcf);
  mem_xor(in_RDI,in_RCX,0x10);
  gimli_core_u8((uint8_t *)CONCAT17(in_R9B,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcf);
  mem_xor(in_RDI,(void *)((long)in_RCX + 0x10),0x10);
  gimli_core_u8((uint8_t *)CONCAT17(in_R9B,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcf);
  (*in_RDI)[0] = (*in_RDI)[0] ^ 0x14;
  mem_xor(*in_RDI + 1,in_R8,0xf);
  gimli_core_u8((uint8_t *)CONCAT17(in_R9B,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcf);
  mem_xor(in_RDI,(void *)((long)in_R8 + 0xf),5);
  store64_le(&stack0xffffffffffffffcf,in_RSI);
  mem_xor(*in_RDI + 4,&stack0xffffffffffffffcf,8);
  gimli_core_u8((uint8_t *)CONCAT17(in_R9B,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcf);
  return;
}

Assistant:

static void
hydro_secretbox_setup(uint8_t buf[gimli_BLOCKBYTES], uint64_t msg_id,
                      const char    ctx[hydro_secretbox_CONTEXTBYTES],
                      const uint8_t key[hydro_secretbox_KEYBYTES],
                      const uint8_t iv[hydro_secretbox_IVBYTES], uint8_t key_tag)
{
    static const uint8_t prefix[] = { 6, 's', 'b', 'x', '2', '5', '6', 8 };
    uint8_t              msg_id_le[8];

    mem_zero(buf, gimli_BLOCKBYTES);
    COMPILER_ASSERT(hydro_secretbox_CONTEXTBYTES == 8);
    COMPILER_ASSERT(sizeof prefix + hydro_secretbox_CONTEXTBYTES <= gimli_RATE);
    memcpy(buf, prefix, sizeof prefix);
    memcpy(buf + sizeof prefix, ctx, hydro_secretbox_CONTEXTBYTES);
    COMPILER_ASSERT(sizeof prefix + hydro_secretbox_CONTEXTBYTES == gimli_RATE);
    gimli_core_u8(buf, gimli_TAG_HEADER);

    COMPILER_ASSERT(hydro_secretbox_KEYBYTES == 2 * gimli_RATE);
    mem_xor(buf, key, gimli_RATE);
    gimli_core_u8(buf, key_tag);
    mem_xor(buf, key + gimli_RATE, gimli_RATE);
    gimli_core_u8(buf, key_tag);

    COMPILER_ASSERT(hydro_secretbox_IVBYTES < gimli_RATE * 2);
    buf[0] ^= hydro_secretbox_IVBYTES;
    mem_xor(&buf[1], iv, gimli_RATE - 1);
    gimli_core_u8(buf, gimli_TAG_HEADER);
    mem_xor(buf, iv + gimli_RATE - 1, hydro_secretbox_IVBYTES - (gimli_RATE - 1));
    STORE64_LE(msg_id_le, msg_id);
    COMPILER_ASSERT(hydro_secretbox_IVBYTES - gimli_RATE + 8 <= gimli_RATE);
    mem_xor(buf + hydro_secretbox_IVBYTES - gimli_RATE, msg_id_le, 8);
    gimli_core_u8(buf, gimli_TAG_HEADER);
}